

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDepsHelper
          (DescriptorBuilder *this,DescriptorPool *pool,string *name,bool build_it)

{
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  byte in_CL;
  DescriptorPool *in_RDX;
  DescriptorBuilder *in_RSI;
  Symbol SVar4;
  MutexLockMaybe lock;
  Symbol result;
  Mutex *in_stack_ffffffffffffff58;
  Type in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  anon_union_8_8_13f84498_for_Symbol_2 in_stack_ffffffffffffff68;
  Type in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar5;
  undefined4 uStack_64;
  undefined4 uStack_54;
  undefined1 in_stack_ffffffffffffffcf;
  undefined7 in_stack_ffffffffffffffd0;
  Symbol local_10;
  
  bVar1 = in_CL & 1;
  internal::MutexLockMaybe::MutexLockMaybe
            ((MutexLockMaybe *)
             CONCAT17(in_stack_ffffffffffffff67,
                      CONCAT16(in_stack_ffffffffffffff66,
                               CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))),
             in_stack_ffffffffffffff58);
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x62d92a);
  SVar4 = DescriptorPool::Tables::FindSymbol
                    ((Tables *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (string *)in_stack_ffffffffffffff68.descriptor);
  local_10.field_1 = SVar4.field_1;
  local_10.type = SVar4.type;
  bVar2 = Symbol::IsNull(&local_10);
  uVar5 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff74);
  if ((bVar2) &&
     ((in_RSI->options_to_interpret_).
      super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    SVar4 = FindSymbolNotEnforcingDepsHelper
                      (in_RSI,in_RDX,(string *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                       (bool)in_stack_ffffffffffffffcf);
    in_stack_ffffffffffffff68 = SVar4.field_1;
    in_stack_ffffffffffffff70 = SVar4.type;
    local_10._0_8_ = CONCAT44(uStack_54,in_stack_ffffffffffffff70);
    local_10.field_1 = in_stack_ffffffffffffff68;
  }
  uVar3 = Symbol::IsNull(&local_10);
  if ((((bool)uVar3) && ((bVar1 & 1) != 0)) &&
     (in_stack_ffffffffffffff66 =
           DescriptorPool::TryFindSymbolInFallbackDatabase
                     ((DescriptorPool *)result._0_8_,(string *)this),
     (bool)in_stack_ffffffffffffff66)) {
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  *)0x62da62);
    SVar4 = DescriptorPool::Tables::FindSymbol
                      ((Tables *)CONCAT44(uVar5,in_stack_ffffffffffffff70),
                       (string *)in_stack_ffffffffffffff68.descriptor);
    local_10.field_1 = SVar4.field_1;
    in_stack_ffffffffffffff60 = SVar4.type;
    local_10._0_8_ = CONCAT44(uStack_64,in_stack_ffffffffffffff60);
  }
  internal::MutexLockMaybe::~MutexLockMaybe
            ((MutexLockMaybe *)
             CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff66,
                                     CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)))
            );
  SVar4._0_8_ = local_10._0_8_ & 0xffffffff;
  SVar4.field_1.descriptor = local_10.field_1.descriptor;
  return SVar4;
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDepsHelper(
    const DescriptorPool* pool, const std::string& name, bool build_it) {
  // If we are looking at an underlay, we must lock its mutex_, since we are
  // accessing the underlay's tables_ directly.
  MutexLockMaybe lock((pool == pool_) ? nullptr : pool->mutex_);

  Symbol result = pool->tables_->FindSymbol(name);
  if (result.IsNull() && pool->underlay_ != nullptr) {
    // Symbol not found; check the underlay.
    result = FindSymbolNotEnforcingDepsHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // With lazily_build_dependencies_, a symbol lookup at cross link time is
    // not guaranteed to be successful. In most cases, build_it will be false,
    // which intentionally prevents us from building an import until it's
    // actually needed. In some cases, like registering an extension, we want
    // to build the file containing the symbol, and build_it will be set.
    // Also, build_it will be true when !lazily_build_dependencies_, to provide
    // better error reporting of missing dependencies.
    if (build_it && pool->TryFindSymbolInFallbackDatabase(name)) {
      result = pool->tables_->FindSymbol(name);
    }
  }

  return result;
}